

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

ParseTokenKind __thiscall
TTD::TextFormatReader::Scan
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  ParseTokenKind PVar2;
  char16 local_2a [4];
  char16 c;
  
  local_2a[0] = L'\0';
  (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
switchD_00838b6f_caseD_9:
  bVar1 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
  if (!bVar1) {
    return Error;
  }
  switch(local_2a[0]) {
  case L'\t':
  case L'\n':
  case L'\r':
  case L' ':
    goto switchD_00838b6f_caseD_9;
  case L'!':
    PVar2 = ScanLogTag(this,charList);
    return PVar2;
  case L'#':
    PVar2 = ScanSpecialNumber(this);
    return PVar2;
  case L'$':
    PVar2 = ScanEnumTag(this,charList);
    return PVar2;
  case L'*':
    PVar2 = ScanAddress(this,charList);
    return PVar2;
  case L'+':
  case L'-':
  case L'0':
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
  case L'8':
  case L'9':
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (charList,local_2a);
    PVar2 = ScanNumber(this,charList);
    return PVar2;
  case L',':
    return Comma;
  case L':':
    return Colon;
  case L'@':
    PVar2 = ScanString(this,charList);
    return PVar2;
  default:
    if (local_2a[0] == L'\0') {
      return (uint)(ushort)local_2a[0];
    }
    if (local_2a[0] == L'[') {
      return LBrack;
    }
    if (local_2a[0] == L']') {
      return RBrack;
    }
    if (local_2a[0] == L'{') {
      return LCurly;
    }
    if (local_2a[0] == L'~') {
      PVar2 = ScanWellKnownToken(this,charList);
      return PVar2;
    }
    if (local_2a[0] == L'}') {
      return RCurly;
    }
  case L'\v':
  case L'\f':
  case L'\x0e':
  case L'\x0f':
  case L'\x10':
  case L'\x11':
  case L'\x12':
  case L'\x13':
  case L'\x14':
  case L'\x15':
  case L'\x16':
  case L'\x17':
  case L'\x18':
  case L'\x19':
  case L'\x1a':
  case L'\x1b':
  case L'\x1c':
  case L'\x1d':
  case L'\x1e':
  case L'\x1f':
  case L'\"':
  case L'%':
  case L'&':
  case L'\'':
  case L'(':
  case L')':
  case L'.':
  case L'/':
  case L';':
  case L'<':
  case L'=':
  case L'>':
  case L'?':
    PVar2 = ScanNakedString(this,local_2a[0]);
    return PVar2;
  }
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::Scan(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        charList.Clear();

        while(this->ReadRawChar(&c))
        {
            switch(c)
            {
            case 0:
                return NSTokens::ParseTokenKind::Error; //we shouldn't hit EOF explicitly here
            case _u('\t'):
            case _u('\r'):
            case _u('\n'):
            case _u(' '):
                //WS - keep looping
                break;
            case _u(','):
                return NSTokens::ParseTokenKind::Comma;
            case _u(':'):
                return NSTokens::ParseTokenKind::Colon;
            case _u('['):
                return NSTokens::ParseTokenKind::LBrack;
            case _u(']'):
                return NSTokens::ParseTokenKind::RBrack;
            case _u('{'):
                return NSTokens::ParseTokenKind::LCurly;
            case _u('}'):
                return NSTokens::ParseTokenKind::RCurly;
            case _u('#'):
                //# starts special double/number value representation
                return this->ScanSpecialNumber();
            case _u('-'):
            case _u('+'):
            case _u('0'):
            case _u('1'):
            case _u('2'):
            case _u('3'):
            case _u('4'):
            case _u('5'):
            case _u('6'):
            case _u('7'):
            case _u('8'):
            case _u('9'):
                //decimal digit or (-,+) starts a number
                charList.Add(c);
                return this->ScanNumber(charList);
            case _u('*'):
                //address
                return this->ScanAddress(charList);
            case _u('!'):
                //log tag
                return this->ScanLogTag(charList);
            case _u('$'):
                //enumeration value tag
                return this->ScanEnumTag(charList);
            case _u('~'):
                //wellknown token
                return this->ScanWellKnownToken(charList);
            case _u('@'):
                //string
                return this->ScanString(charList);
            default:
                //it is a naked literal value (or an error)
                return this->ScanNakedString(c);
            }
        }

        return NSTokens::ParseTokenKind::Error;
    }